

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  uint64_t uVar2;
  VkGraphicsPipelineCreateInfo *pVVar3;
  VkComputePipelineCreateInfo *pVVar4;
  VkRayTracingPipelineCreateInfoKHR *pVVar5;
  DatabaseInterface *db_iface;
  undefined8 uVar6;
  undefined8 uVar7;
  _Manager_type p_Var8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  mapped_type *pmVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *filter;
  size_t i;
  long lVar17;
  __node_base *p_Var18;
  ulong uVar19;
  ResourceTag tag;
  VulkanDevice *this;
  size_t sStackY_1ca0;
  bool module_only;
  ulong local_1c80;
  int local_1c78;
  DisasmMethod method;
  DatabaseInterface *local_1c70;
  ulong local_1c68;
  StateReplayer state_replayer_1;
  VkShaderModule module;
  ulong local_1c38;
  StateReplayer state_replayer;
  string disasm_match;
  string output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  replays_raytracing;
  Options local_1b98;
  string local_1b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae0;
  string json_path;
  CLICallbacks local_1aa0;
  unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
  unique_shader_modules;
  string local_19f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19d0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_graphics;
  string local_18d0;
  string local_18b0;
  DisasmReplayer replayer;
  FilterReplayer filter_replayer;
  CLIParser parser;
  CLICallbacks local_13c0;
  VulkanDevice device;
  
  json_path._M_dataplus._M_p = (pointer)&json_path.field_2;
  json_path._M_string_length = 0;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  json_path.field_2._M_local_buf[0] = '\0';
  output.field_2._M_local_buf[0] = '\0';
  disasm_match._M_dataplus._M_p = (pointer)&disasm_match.field_2;
  disasm_match._M_string_length = 0;
  disasm_match.field_2._M_local_buf[0] = '\0';
  local_1b98.enable_validation = false;
  local_1b98.want_amd_shader_info = false;
  local_1b98.null_device = false;
  local_1b98.want_pipeline_stats = false;
  local_1b98.device_index = -1;
  module_only = false;
  filter_graphics._M_h._M_buckets = &filter_graphics._M_h._M_single_bucket;
  filter_graphics._M_h._M_bucket_count = 1;
  filter_graphics._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_graphics._M_h._M_element_count = 0;
  filter_graphics._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_graphics._M_h._M_rehash_policy._M_next_resize = 0;
  filter_graphics._M_h._M_single_bucket = (__node_base_ptr)0x0;
  filter_compute._M_h._M_buckets = &filter_compute._M_h._M_single_bucket;
  filter_compute._M_h._M_bucket_count = 1;
  filter_compute._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_compute._M_h._M_element_count = 0;
  filter_compute._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_compute._M_h._M_rehash_policy._M_next_resize = 0;
  filter_compute._M_h._M_single_bucket = (__node_base_ptr)0x0;
  filter_raytracing._M_h._M_buckets = &filter_raytracing._M_h._M_single_bucket;
  filter_raytracing._M_h._M_bucket_count = 1;
  filter_raytracing._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_raytracing._M_h._M_element_count = 0;
  filter_raytracing._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_raytracing._M_h._M_rehash_policy._M_next_resize = 0;
  filter_raytracing._M_h._M_single_bucket = (__node_base_ptr)0x0;
  filter_modules._M_h._M_buckets = &filter_modules._M_h._M_single_bucket;
  filter_modules._M_h._M_bucket_count = 1;
  local_1aa0.callbacks._M_h._M_buckets = &local_1aa0.callbacks._M_h._M_single_bucket;
  local_1aa0.callbacks._M_h._M_bucket_count = 1;
  local_1aa0.callbacks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1aa0.callbacks._M_h._M_element_count = 0;
  local_1aa0.callbacks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1aa0.callbacks._M_h._M_rehash_policy._M_next_resize = 0;
  local_1aa0.callbacks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1aa0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1aa0.error_handler.super__Function_base._M_functor._8_8_ = (VkInstance)0x0;
  local_1aa0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1aa0.error_handler._M_invoker = (_Invoker_type)0x0;
  local_1aa0.default_handler.super__Function_base._M_functor._M_unused._M_object = &json_path;
  local_1b98.application_info = (VkApplicationInfo *)0x0;
  local_1b98.features = (VkPhysicalDeviceFeatures2 *)0x0;
  method = Asm;
  filter_modules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  filter_modules._M_h._M_element_count = 0;
  local_1aa0.default_handler.super__Function_base._M_functor._8_8_ = 0;
  filter_modules._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  filter_modules._M_h._M_rehash_policy._M_next_resize = 0;
  filter_modules._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1aa0.default_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:983:24)>
       ::_M_manager;
  local_1aa0.default_handler._M_invoker =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:983:24)>
       ::_M_invoke;
  device.super_DeviceQueryInterface = (DeviceQueryInterface)0x0;
  device._1_7_ = 0;
  device.instance = (VkInstance)0x0;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:984:20)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:984:20)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--help",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:985:28)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:985:28)>
               ::_M_manager;
  device._0_8_ = &local_1b98;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--device-index",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:986:33)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:986:33)>
               ::_M_manager;
  device._0_8_ = &local_1b98;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--enable-validation",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &output;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:987:22)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:987:22)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--output",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &method;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:988:22)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:988:22)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--target",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &module_only;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:991:27)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:991:27)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--module-only",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &filter_graphics;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:992:31)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:992:31)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--filter-graphics",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &filter_compute;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:995:30)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:995:30)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--filter-compute",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &filter_raytracing;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:998:33)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:998:33)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--filter-raytracing",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &filter_modules;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1001:29)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1001:29)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--filter-module",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  device.instance = (VkInstance)0x0;
  device._0_8_ = &disasm_match;
  device.device =
       (VkDevice)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1004:28)>
       ::_M_invoke;
  device.gpu = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1004:28)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1aa0,"--disasm-match",(function<void_(Fossilize::CLIParser_&)> *)&device);
  if (device.gpu != (VkPhysicalDevice)0x0) {
    (*(code *)device.gpu)(&device,&device,3);
  }
  p_Var8 = local_1aa0.error_handler.super__Function_base._M_manager;
  device._0_8_ = local_1aa0.error_handler.super__Function_base._M_functor._M_unused._M_object;
  device.instance = (VkInstance)local_1aa0.error_handler.super__Function_base._M_functor._8_8_;
  local_1aa0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1aa0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  device.gpu = (VkPhysicalDevice)local_1aa0.error_handler.super__Function_base._M_manager;
  local_1aa0.error_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1007:22)>
       ::_M_manager;
  device.device = (VkDevice)local_1aa0.error_handler._M_invoker;
  local_1aa0.error_handler._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1007:22)>
       ::_M_invoke;
  if ((VkPhysicalDevice)p_Var8 != (VkPhysicalDevice)0x0) {
    (*p_Var8)(&device,&device,3);
  }
  Fossilize::CLICallbacks::CLICallbacks(&local_13c0,&local_1aa0);
  Fossilize::CLIParser::CLIParser(&parser,&local_13c0,argc + -1,argv + 1);
  Fossilize::CLICallbacks::~CLICallbacks(&local_13c0);
  bVar9 = Fossilize::CLIParser::parse(&parser);
  if (!bVar9) {
LAB_0012a527:
    iVar15 = 1;
    goto LAB_0012b63d;
  }
  iVar15 = 0;
  if (parser.ended_state != false) goto LAB_0012b63d;
  if (json_path._M_string_length == 0) {
    fwrite("Fossilize ERROR: No path to serialized state provided.\n",0x37,1,_stderr);
    fflush(_stderr);
    print_help();
    goto LAB_0012a527;
  }
  iVar15 = 1;
  local_1c70 = Fossilize::create_database(json_path._M_dataplus._M_p,ReadOnly);
  iVar11 = (*local_1c70->_vptr_DatabaseInterface[2])();
  if ((char)iVar11 != '\0') {
    FilterReplayer::FilterReplayer(&filter_replayer);
    state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = &device;
    Fossilize::VulkanDevice::VulkanDevice(this);
    iVar15 = 0;
    if (method != ISA) {
LAB_0012a5b5:
      local_1c80 = CONCAT71(local_1c80._1_7_,
                            ((filter_compute._M_h._M_element_count != 0 ||
                             filter_graphics._M_h._M_element_count != 0) ||
                            filter_raytracing._M_h._M_element_count != 0) ||
                            filter_modules._M_h._M_element_count != 0);
      local_1c78 = iVar15;
      if ((((filter_compute._M_h._M_element_count != 0 || filter_graphics._M_h._M_element_count != 0
            ) || filter_raytracing._M_h._M_element_count != 0) ||
           filter_modules._M_h._M_element_count != 0) && (module_only == false)) {
        Fossilize::StateReplayer::StateReplayer(&state_replayer_1);
        Fossilize::StateReplayer::set_resolve_derivative_pipeline_handles(&state_replayer_1,false);
        Fossilize::StateReplayer::set_resolve_shader_module_handles(&state_replayer_1,false);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_replayer.filter_graphics._M_h,&filter_graphics);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_replayer.filter_compute._M_h,&filter_compute);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_replayer.filter_raytracing._M_h,&filter_raytracing);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_replayer.filter_modules._M_h,&filter_modules);
        local_1c68 = filter_replayer.filter_modules._M_h._M_element_count;
        for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 4) {
          replay_all_hashes(*(ResourceTag *)((long)main::early_playback_order + lVar17),local_1c70,
                            &state_replayer_1,&filter_replayer.super_StateCreatorInterface,
                            &state_json,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)0x0);
        }
        if (local_1c68 == 0) {
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&replayer,&filter_replayer.filter_graphics._M_h);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&unique_shader_modules,&filter_replayer.filter_compute._M_h);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable(&replays_raytracing._M_h,&filter_replayer.filter_raytracing._M_h);
          db_iface = local_1c70;
          replay_all_hashes(RESOURCE_GRAPHICS_PIPELINE,local_1c70,&state_replayer_1,
                            &filter_replayer.super_StateCreatorInterface,&state_json,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&replayer);
          replay_all_hashes(RESOURCE_COMPUTE_PIPELINE,db_iface,&state_replayer_1,
                            &filter_replayer.super_StateCreatorInterface,&state_json,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&unique_shader_modules);
          replay_all_hashes(RESOURCE_RAYTRACING_PIPELINE,db_iface,&state_replayer_1,
                            &filter_replayer.super_StateCreatorInterface,&state_json,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&replays_raytracing._M_h);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&replays_raytracing._M_h);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&unique_shader_modules);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&replayer);
        }
        else {
          for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 4) {
            replay_all_hashes(*(ResourceTag *)((long)main::playback_order + lVar17),local_1c70,
                              &state_replayer_1,&filter_replayer.super_StateCreatorInterface,
                              &state_json,
                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)0x0);
          }
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_graphics._M_h,&filter_replayer.filter_graphics);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_compute._M_h,&filter_replayer.filter_compute);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_raytracing._M_h,&filter_replayer.filter_raytracing);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&filter_modules._M_h,&filter_replayer.filter_modules);
        p_Var18 = &filter_replayer.filter_modules_promoted._M_h._M_before_begin;
        while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
          replayer.super_StateCreatorInterface._vptr_StateCreatorInterface =
               *(_func_int ***)(p_Var18 + 1);
          std::__detail::
          _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&filter_modules._M_h,(value_type *)&replayer);
        }
        Fossilize::StateReplayer::~StateReplayer(&state_replayer_1);
      }
      Fossilize::StateReplayer::StateReplayer(&state_replayer);
      if (device.device == (VkDevice)0x0) {
        this = (VulkanDevice *)0x0;
      }
      DisasmReplayer::DisasmReplayer(&replayer,this);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&replayer.filter_graphics._M_h,&filter_graphics);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&replayer.filter_compute._M_h,&filter_compute);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&replayer.filter_raytracing._M_h,&filter_raytracing);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&replayer.filter_modules._M_h,&filter_modules);
      for (lVar17 = 0; lVar17 != 0x24; lVar17 = lVar17 + 4) {
        tag = *(ResourceTag *)((long)main::playback_order + lVar17);
        if ((module_only != true) ||
           (bVar9 = tag == RESOURCE_SHADER_MODULE, tag = RESOURCE_SHADER_MODULE, bVar9)) {
          pcVar16 = main::tag_names[tag];
          fprintf(_stderr,"Fossilize INFO: Replaying tag: %s\n",pcVar16);
          fflush(_stderr);
          if ((char)local_1c80 == '\0') {
            filter = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)0x0;
          }
          else {
            filter = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)0x0;
            switch(tag) {
            case RESOURCE_SHADER_MODULE:
              filter = &replayer.filter_modules;
              break;
            case RESOURCE_GRAPHICS_PIPELINE:
              filter = &replayer.filter_graphics;
              break;
            case RESOURCE_COMPUTE_PIPELINE:
              filter = &replayer.filter_compute;
              break;
            case RESOURCE_RAYTRACING_PIPELINE:
              filter = &replayer.filter_raytracing;
            }
          }
          replay_all_hashes(tag,local_1c70,&state_replayer,&replayer.super_StateCreatorInterface,
                            &state_json,filter);
          fprintf(_stderr,"Fossilize INFO: Replayed tag: %s\n",pcVar16);
          fflush(_stderr);
        }
      }
      unique_shader_modules._M_h._M_buckets = &unique_shader_modules._M_h._M_single_bucket;
      unique_shader_modules._M_h._M_bucket_count = 1;
      unique_shader_modules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      unique_shader_modules._M_h._M_element_count = 0;
      unique_shader_modules._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      unique_shader_modules._M_h._M_rehash_policy._M_next_resize = 0;
      unique_shader_modules._M_h._M_single_bucket = (__node_base_ptr)0x0;
      replays_raytracing._M_h._M_buckets = &replays_raytracing._M_h._M_before_begin._M_nxt;
      if (module_only == false) {
        replays_raytracing._M_h._M_bucket_count = 0;
        replays_raytracing._M_h._M_before_begin._M_nxt._0_1_ = 0;
        local_1c38 = (long)replayer.graphics_infos.
                           super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)replayer.graphics_infos.
                           super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
        for (local_1c80 = 0; uVar19 = 0xffffffffffffffff, local_1c80 != local_1c38;
            local_1c80 = local_1c80 + 1) {
          pVVar3 = replayer.graphics_infos.
                   super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_1c80];
          lVar17 = 0;
          while (uVar19 + 1 < (ulong)pVVar3->stageCount) {
            module = *(VkShaderModule *)((long)&pVVar3->pStages->module + lVar17);
            local_1c68 = uVar19 + 1;
            std::__detail::
            _Insert_base<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&unique_shader_modules,&module);
            pmVar12 = std::__detail::
                      _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&replayer.module_to_index,&module);
            uVar1 = *pmVar12;
            disassemble_spirv_abi_cxx11_
                      ((string *)&state_replayer_1,&device,
                       replayer.graphics_pipelines.
                       super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
                       super__Vector_impl_data._M_start[local_1c80],method,
                       *(VkShaderStageFlagBits *)((long)&pVVar3->pStages->stage + lVar17),
                       replayer.shader_module_infos.
                       super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar1],
                       *(char **)((long)&pVVar3->pStages->pName + lVar17));
            std::__cxx11::string::operator=
                      ((string *)&replays_raytracing,(string *)&state_replayer_1);
            std::__cxx11::string::_M_dispose();
            uVar2 = replayer.module_hashes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar1];
            std::operator+(&local_1b60,&output,"/");
            uint64_string_abi_cxx11_(&local_1b80,uVar2);
            std::operator+(&local_1b40,&local_1b60,&local_1b80);
            std::operator+(&local_1b20,&local_1b40,".");
            std::operator+(&local_1b00,&local_1b20,
                           *(char **)((long)&pVVar3->pStages->pName + lVar17));
            std::operator+(&local_1ae0,&local_1b00,".");
            uint64_string_abi_cxx11_
                      (&local_18b0,
                       replayer.graphics_hashes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[local_1c80]);
            std::operator+(&local_19f0,&local_1ae0,&local_18b0);
            std::operator+(&local_19d0,&local_19f0,".");
            stage_to_string_abi_cxx11_
                      (&local_18d0,
                       *(VkShaderStageFlagBits *)((long)&pVVar3->pStages->stage + lVar17));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &state_replayer_1,&local_19d0,&local_18d0);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            if (disasm_match._M_string_length == 0) {
              fprintf(_stderr,"Fossilize INFO: Dumping disassembly to: %s\n",state_replayer_1.impl);
              uVar19 = local_1c68;
LAB_0012af25:
              fflush(_stderr);
            }
            else {
              lVar13 = std::__cxx11::string::find
                                 ((string *)&replays_raytracing,(ulong)&disasm_match);
              uVar19 = local_1c68;
              if (lVar13 != -1) {
                fprintf(_stderr,
                        "Fossilize INFO: Found matching string, dumping disassembly to: %s\n",
                        state_replayer_1.impl);
                goto LAB_0012af25;
              }
            }
            bVar9 = Fossilize::write_string_to_file
                              ((char *)state_replayer_1.impl,
                               (char *)replays_raytracing._M_h._M_buckets);
            if (!bVar9) {
              fprintf(_stderr,"Fossilize ERROR: Failed to write disassembly to file: %s\n",
                      output._M_dataplus._M_p);
              fflush(_stderr);
              local_1c78 = 1;
            }
            lVar17 = lVar17 + 0x30;
            std::__cxx11::string::_M_dispose();
            if (!bVar9) goto LAB_0012b5cc;
          }
        }
        local_1c80 = (long)replayer.compute_infos.
                           super__Vector_base<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)replayer.compute_infos.
                           super__Vector_base<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
        uVar19 = 0;
        do {
          if (local_1c80 == uVar19) {
            local_1c38 = (long)replayer.raytracing_infos.
                               super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)replayer.raytracing_infos.
                               super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3;
            uVar19 = 0;
            while (uVar19 != local_1c38) {
              pVVar5 = replayer.raytracing_infos.
                       super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19];
              lVar17 = 0;
              uVar14 = 0xffffffffffffffff;
              local_1c80 = uVar19;
              while( true ) {
                if ((ulong)pVVar5->stageCount <= uVar14 + 1) break;
                module = *(VkShaderModule *)((long)&pVVar5->pStages->module + lVar17);
                local_1c68 = uVar14 + 1;
                std::__detail::
                _Insert_base<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&unique_shader_modules,&module);
                pmVar12 = std::__detail::
                          _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&replayer.module_to_index,&module);
                uVar1 = *pmVar12;
                disassemble_spirv_abi_cxx11_
                          ((string *)&state_replayer_1,&device,
                           replayer.raytracing_pipelines.
                           super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[local_1c80],method,
                           *(VkShaderStageFlagBits *)((long)&pVVar5->pStages->stage + lVar17),
                           replayer.shader_module_infos.
                           super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar1],
                           *(char **)((long)&pVVar5->pStages->pName + lVar17));
                std::__cxx11::string::operator=
                          ((string *)&replays_raytracing,(string *)&state_replayer_1);
                std::__cxx11::string::_M_dispose();
                uVar2 = replayer.module_hashes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1];
                std::operator+(&local_1b60,&output,"/");
                uint64_string_abi_cxx11_(&local_1b80,uVar2);
                std::operator+(&local_1b40,&local_1b60,&local_1b80);
                std::operator+(&local_1b20,&local_1b40,".");
                std::operator+(&local_1b00,&local_1b20,
                               *(char **)((long)&pVVar5->pStages->pName + lVar17));
                std::operator+(&local_1ae0,&local_1b00,".");
                uint64_string_abi_cxx11_
                          (&local_18b0,
                           replayer.raytracing_hashes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[local_1c80]);
                std::operator+(&local_19f0,&local_1ae0,&local_18b0);
                std::operator+(&local_19d0,&local_19f0,".");
                stage_to_string_abi_cxx11_
                          (&local_18d0,
                           *(VkShaderStageFlagBits *)((long)&pVVar5->pStages->stage + lVar17));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &state_replayer_1,&local_19d0,&local_18d0);
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                if (disasm_match._M_string_length == 0) {
                  pcVar16 = "Fossilize INFO: Dumping disassembly to: %s\n";
LAB_0012b5a6:
                  fprintf(_stderr,pcVar16,state_replayer_1.impl);
                  fflush(_stderr);
                }
                else {
                  lVar13 = std::__cxx11::string::find
                                     ((string *)&replays_raytracing,(ulong)&disasm_match);
                  if (lVar13 != -1) {
                    pcVar16 = "Fossilize INFO: Found matching string, dumping disassembly to: %s\n";
                    goto LAB_0012b5a6;
                  }
                }
                bVar9 = Fossilize::write_string_to_file
                                  ((char *)state_replayer_1.impl,
                                   (char *)replays_raytracing._M_h._M_buckets);
                if (!bVar9) {
                  fprintf(_stderr,"Fossilize ERROR: Failed to write disassembly to file: %s\n",
                          output._M_dataplus._M_p);
                  fflush(_stderr);
                  local_1c78 = 1;
                }
                lVar17 = lVar17 + 0x30;
                std::__cxx11::string::_M_dispose();
                uVar14 = local_1c68;
                if (!bVar9) goto LAB_0012b5cc;
              }
              uVar19 = local_1c80 + 1;
            }
            fprintf(_stderr,
                    "Fossilize INFO: Shader modules used: %u, shader modules in database: %u\n",
                    unique_shader_modules._M_h._M_element_count & 0xffffffff,
                    (ulong)((long)replayer.shader_module_infos.
                                  super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)replayer.shader_module_infos.
                                 super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
            fflush(_stderr);
            bVar9 = true;
            break;
          }
          pVVar4 = replayer.compute_infos.
                   super__Vector_base<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19];
          module = (pVVar4->stage).module;
          std::__detail::
          _Insert_base<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&unique_shader_modules,&module);
          pmVar12 = std::__detail::
                    _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&replayer.module_to_index,&module);
          uVar1 = *pmVar12;
          disassemble_spirv_abi_cxx11_
                    ((string *)&state_replayer_1,&device,
                     replayer.compute_pipelines.
                     super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19],method,(pVVar4->stage).stage,
                     replayer.shader_module_infos.
                     super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar1],(pVVar4->stage).pName);
          std::__cxx11::string::operator=((string *)&replays_raytracing,(string *)&state_replayer_1)
          ;
          std::__cxx11::string::_M_dispose();
          uVar2 = replayer.module_hashes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1];
          std::operator+(&local_1b60,&output,"/");
          uint64_string_abi_cxx11_(&local_1b80,uVar2);
          std::operator+(&local_1b40,&local_1b60,&local_1b80);
          std::operator+(&local_1b20,&local_1b40,".");
          std::operator+(&local_1b00,&local_1b20,(pVVar4->stage).pName);
          std::operator+(&local_1ae0,&local_1b00,".");
          uint64_string_abi_cxx11_
                    (&local_18b0,
                     replayer.compute_hashes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19]);
          std::operator+(&local_19f0,&local_1ae0,&local_18b0);
          std::operator+(&local_19d0,&local_19f0,".");
          stage_to_string_abi_cxx11_(&local_18d0,(pVVar4->stage).stage);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &state_replayer_1,&local_19d0,&local_18d0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          if (disasm_match._M_string_length == 0) {
            pcVar16 = "Fossilize INFO: Dumping disassembly to: %s\n";
LAB_0012b258:
            fprintf(_stderr,pcVar16,state_replayer_1.impl);
            fflush(_stderr);
          }
          else {
            lVar17 = std::__cxx11::string::find((string *)&replays_raytracing,(ulong)&disasm_match);
            if (lVar17 != -1) {
              pcVar16 = "Fossilize INFO: Found matching string, dumping disassembly to: %s\n";
              goto LAB_0012b258;
            }
          }
          bVar10 = Fossilize::write_string_to_file
                             ((char *)state_replayer_1.impl,
                              (char *)replays_raytracing._M_h._M_buckets);
          if (!bVar10) {
            fprintf(_stderr,"Fossilize ERROR: Failed to write disassembly to file: %s\n",
                    output._M_dataplus._M_p);
            fflush(_stderr);
            local_1c78 = 1;
          }
          std::__cxx11::string::_M_dispose();
          uVar19 = uVar19 + 1;
          bVar9 = false;
        } while (bVar10);
        goto LAB_0012b5cf;
      }
      replays_raytracing._M_h._M_bucket_count = 0;
      replays_raytracing._M_h._M_before_begin._M_nxt._0_1_ = 0;
      local_1c80 = (long)replayer.shader_module_infos.
                         super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)replayer.shader_module_infos.
                         super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar19 = 0;
      do {
        uVar14 = uVar19;
        if (local_1c80 == uVar14) break;
        disassemble_spirv_abi_cxx11_
                  ((string *)&state_replayer_1,&device,(VkPipeline)0x0,method,VK_SHADER_STAGE_ALL,
                   replayer.shader_module_infos.
                   super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14],(char *)0x0);
        std::__cxx11::string::operator=((string *)&replays_raytracing,(string *)&state_replayer_1);
        std::__cxx11::string::_M_dispose();
        uVar2 = replayer.module_hashes.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14];
        std::operator+(&local_19d0,&output,"/");
        uint64_string_abi_cxx11_(&local_19f0,uVar2);
        std::operator+((string *)&state_replayer_1,&local_19d0,&local_19f0);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        if (disasm_match._M_string_length == 0) {
          pcVar16 = "Fossilize INFO: Dumping disassembly to: %s\n";
LAB_0012abb3:
          fprintf(_stderr,pcVar16,state_replayer_1.impl);
          fflush(_stderr);
        }
        else {
          lVar17 = std::__cxx11::string::find((string *)&replays_raytracing,(ulong)&disasm_match);
          if (lVar17 != -1) {
            pcVar16 = "Fossilize INFO: Found matching string, dumping disassembly to: %s\n";
            goto LAB_0012abb3;
          }
        }
        bVar9 = Fossilize::write_string_to_file
                          ((char *)state_replayer_1.impl,(char *)replays_raytracing._M_h._M_buckets)
        ;
        if (!bVar9) {
          fprintf(_stderr,"Fossilize ERROR: Failed to write disassembly to file: %s\n",
                  output._M_dataplus._M_p);
          fflush(_stderr);
          local_1c78 = 1;
        }
        std::__cxx11::string::_M_dispose();
        uVar19 = uVar14 + 1;
      } while (bVar9);
      std::__cxx11::string::_M_dispose();
      iVar15 = local_1c78;
      if (local_1c80 <= uVar14) goto LAB_0012b5e5;
      goto LAB_0012b5e7;
    }
    Fossilize::StateReplayer::StateReplayer((StateReplayer *)&replayer);
    replay_all_hashes(RESOURCE_APPLICATION_INFO,local_1c70,(StateReplayer *)&replayer,
                      &filter_replayer.super_StateCreatorInterface,&state_json,
                      (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x0);
    uVar6 = local_1b98._0_8_;
    local_1b98.want_amd_shader_info = true;
    uVar7 = local_1b98._0_8_;
    local_1b98.device_index = SUB84(uVar6,4);
    local_1b98._0_3_ = SUB83(uVar7,0);
    local_1b98.want_pipeline_stats = true;
    local_1b98.application_info = filter_replayer.app;
    local_1b98.features = filter_replayer.pdf2;
    if (module_only == true) {
      pcVar16 = "Fossilize ERROR: Cannot do module-only disassembly with ISA target.\n";
      sStackY_1ca0 = 0x44;
LAB_0012a583:
      fwrite(pcVar16,sStackY_1ca0,1,_stderr);
      fflush(_stderr);
      iVar15 = 1;
      bVar9 = false;
    }
    else {
      bVar9 = Fossilize::VulkanDevice::init_device(&device,&local_1b98);
      if (!bVar9) {
        pcVar16 = "Fossilize ERROR: Failed to create device.\n";
        sStackY_1ca0 = 0x2a;
        goto LAB_0012a583;
      }
      iVar15 = 0;
      bVar9 = true;
      if ((device.amd_shader_info == false) && (device.pipeline_stats == false)) {
        pcVar16 = 
        "Fossilize ERROR: Neither AMD_shader_info or executable properties extension are available.\n"
        ;
        sStackY_1ca0 = 0x5b;
        goto LAB_0012a583;
      }
    }
    Fossilize::StateReplayer::~StateReplayer((StateReplayer *)&replayer);
    if (bVar9) goto LAB_0012a5b5;
    goto LAB_0012b60b;
  }
  fprintf(_stderr,"Fossilize ERROR: Failed to open database: %s\n",json_path._M_dataplus._M_p);
  fflush(_stderr);
LAB_0012b632:
  (*local_1c70->_vptr_DatabaseInterface[1])();
LAB_0012b63d:
  Fossilize::CLICallbacks::~CLICallbacks(&parser.cbs);
  Fossilize::CLICallbacks::~CLICallbacks(&local_1aa0);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_modules._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_raytracing._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_compute._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&filter_graphics._M_h);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return iVar15;
LAB_0012b5cc:
  bVar9 = false;
LAB_0012b5cf:
  std::__cxx11::string::_M_dispose();
  iVar15 = local_1c78;
  if (bVar9) {
LAB_0012b5e5:
    iVar15 = 0;
  }
LAB_0012b5e7:
  std::
  _Hashtable<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&unique_shader_modules._M_h);
  DisasmReplayer::~DisasmReplayer(&replayer);
  Fossilize::StateReplayer::~StateReplayer(&state_replayer);
LAB_0012b60b:
  Fossilize::VulkanDevice::~VulkanDevice(&device);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  FilterReplayer::~FilterReplayer(&filter_replayer);
  goto LAB_0012b632;
}

Assistant:

int main(int argc, char *argv[])
{
	string json_path;
	string output;
	string disasm_match;
	VulkanDevice::Options opts;
	DisasmMethod method = DisasmMethod::Asm;
	bool module_only = false;

	std::unordered_set<Hash> filter_graphics;
	std::unordered_set<Hash> filter_compute;
	std::unordered_set<Hash> filter_raytracing;
	std::unordered_set<Hash> filter_modules;

	CLICallbacks cbs;
	cbs.default_handler = [&](const char *arg) { json_path = arg; };
	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--device-index", [&](CLIParser &parser) { opts.device_index = parser.next_uint(); });
	cbs.add("--enable-validation", [&](CLIParser &) { opts.enable_validation = true; });
	cbs.add("--output", [&](CLIParser &parser) { output = parser.next_string(); });
	cbs.add("--target", [&](CLIParser &parser) {
		method = method_from_string(parser.next_string());
	});
	cbs.add("--module-only", [&](CLIParser &) { module_only = true; });
	cbs.add("--filter-graphics", [&](CLIParser &parser) {
		filter_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-compute", [&](CLIParser &parser) {
		filter_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-raytracing", [&](CLIParser &parser) {
		filter_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-module", [&](CLIParser &parser) {
		filter_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--disasm-match", [&](CLIParser &parser) {
		disasm_match = parser.next_string();
	});
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (json_path.empty())
	{
		LOGE("No path to serialized state provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto resolver = unique_ptr<DatabaseInterface>(create_database(json_path.c_str(), DatabaseMode::ReadOnly));
	if (!resolver->prepare())
	{
		LOGE("Failed to open database: %s\n", json_path.c_str());
		return EXIT_FAILURE;
	}

	FilterReplayer filter_replayer;
	vector<uint8_t> state_json;

	VulkanDevice device;
	if (method == DisasmMethod::ISA)
	{
		StateReplayer application_info_replayer;
		replay_all_hashes(RESOURCE_APPLICATION_INFO, *resolver, application_info_replayer, filter_replayer, state_json, nullptr);

		opts.want_amd_shader_info = true;
		opts.want_pipeline_stats = true;
		opts.application_info = filter_replayer.app;
		opts.features = filter_replayer.pdf2;

		if (module_only)
		{
			LOGE("Cannot do module-only disassembly with ISA target.\n");
			return EXIT_FAILURE;
		}

		if (!device.init_device(opts))
		{
			LOGE("Failed to create device.\n");
			return EXIT_FAILURE;
		}

		if (!device.has_amd_shader_info() && !device.has_pipeline_stats())
		{
			LOGE("Neither AMD_shader_info or executable properties extension are available.\n");
			return EXIT_FAILURE;
		}
	}

	bool use_filter = !filter_graphics.empty() || !filter_compute.empty() ||
	                  !filter_raytracing.empty() || !filter_modules.empty();

	if (use_filter && !module_only)
	{
		StateReplayer state_replayer;

		state_replayer.set_resolve_derivative_pipeline_handles(false);
		state_replayer.set_resolve_shader_module_handles(false);

		filter_replayer.filter_graphics = std::move(filter_graphics);
		filter_replayer.filter_compute = std::move(filter_compute);
		filter_replayer.filter_raytracing = std::move(filter_raytracing);
		filter_replayer.filter_modules = std::move(filter_modules);

		// Don't know which pipelines depend on a module in question, so need to replay all pipelines and promote on demand.
		bool replay_all = !filter_replayer.filter_modules.empty();

		static const ResourceTag early_playback_order[] = {
			RESOURCE_DESCRIPTOR_SET_LAYOUT, // Implicitly pulls in samplers.
			RESOURCE_PIPELINE_LAYOUT,
			RESOURCE_RENDER_PASS,
		};

		for (auto tag : early_playback_order)
			replay_all_hashes(tag, *resolver, state_replayer, filter_replayer, state_json, nullptr);

		if (replay_all)
		{
			static const ResourceTag playback_order[] = {
				RESOURCE_GRAPHICS_PIPELINE,
				RESOURCE_COMPUTE_PIPELINE,
				RESOURCE_RAYTRACING_PIPELINE,
			};

			for (auto tag : playback_order)
				replay_all_hashes(tag, *resolver, state_replayer, filter_replayer, state_json, nullptr);
		}
		else
		{
			// Need copies since we might modify the hashmap inside the replay callback.
			auto replays_graphics = filter_replayer.filter_graphics;
			auto replays_compute = filter_replayer.filter_compute;
			auto replays_raytracing = filter_replayer.filter_raytracing;
			replay_all_hashes(RESOURCE_GRAPHICS_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_graphics);
			replay_all_hashes(RESOURCE_COMPUTE_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_compute);
			replay_all_hashes(RESOURCE_RAYTRACING_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_raytracing);
		}

		filter_graphics = std::move(filter_replayer.filter_graphics);
		filter_compute = std::move(filter_replayer.filter_compute);
		filter_raytracing = std::move(filter_replayer.filter_raytracing);
		filter_modules = std::move(filter_replayer.filter_modules);
		for (auto hash : filter_replayer.filter_modules_promoted)
			filter_modules.insert(hash);
	}

	StateReplayer state_replayer;
	DisasmReplayer replayer(device.get_device() ? &device : nullptr);
	replayer.filter_graphics = std::move(filter_graphics);
	replayer.filter_compute = std::move(filter_compute);
	replayer.filter_raytracing = std::move(filter_raytracing);
	replayer.filter_modules = std::move(filter_modules);

	static const ResourceTag playback_order[] = {
		RESOURCE_APPLICATION_INFO, // This will create the device, etc.
		RESOURCE_SHADER_MODULE, // Kick off shader modules first since it can be done in a thread while we deal with trivial objects.
		RESOURCE_SAMPLER, // Trivial, run in main thread.
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Trivial, run in main thread
		RESOURCE_PIPELINE_LAYOUT, // Trivial, run in main thread
		RESOURCE_RENDER_PASS, // Trivial, run in main thread
		RESOURCE_GRAPHICS_PIPELINE, // Multi-threaded
		RESOURCE_COMPUTE_PIPELINE, // Multi-threaded
		RESOURCE_RAYTRACING_PIPELINE, // Multi-threaded
	};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Info Links",
		"Raytracing Pipeline",
	};

	for (auto &tag : playback_order)
	{
		if (module_only && tag != RESOURCE_SHADER_MODULE)
			continue;

		LOGI("Replaying tag: %s\n", tag_names[tag]);
		const unordered_set<Hash> *filter = nullptr;

		if (use_filter)
		{
			switch (tag)
			{
			case RESOURCE_SHADER_MODULE: filter = &replayer.filter_modules; break;
			case RESOURCE_GRAPHICS_PIPELINE: filter = &replayer.filter_graphics; break;
			case RESOURCE_COMPUTE_PIPELINE: filter = &replayer.filter_compute; break;
			case RESOURCE_RAYTRACING_PIPELINE: filter = &replayer.filter_raytracing; break;
			default: break;
			}
		}

		replay_all_hashes(tag, *resolver, state_replayer, replayer, state_json, filter);
		LOGI("Replayed tag: %s\n", tag_names[tag]);
	}

	unordered_set<VkShaderModule> unique_shader_modules;

	if (module_only)
	{
		string disassembled;
		size_t module_count = replayer.shader_module_infos.size();
		for (size_t i = 0; i < module_count; i++)
		{
			auto *module_info = replayer.shader_module_infos[i];
			disassembled = disassemble_spirv(device, VK_NULL_HANDLE, method, VK_SHADER_STAGE_ALL,
			                                 module_info, nullptr);

			auto module_hash = replayer.module_hashes[i];
			string path = output + "/" + uint64_string(module_hash);

			if (disasm_match.empty())
				LOGI("Dumping disassembly to: %s\n", path.c_str());
			else if (disassembled.find(disasm_match) != std::string::npos)
				LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

			if (!write_string_to_file(path.c_str(), disassembled.c_str()))
			{
				LOGE("Failed to write disassembly to file: %s\n", output.c_str());
				return EXIT_FAILURE;
			}
		}
	}
	else
	{
		string disassembled;
		size_t graphics_pipeline_count = replayer.graphics_infos.size();
		for (size_t i = 0; i < graphics_pipeline_count; i++)
		{
			auto *info = replayer.graphics_infos[i];
			for (uint32_t j = 0; j < info->stageCount; j++)
			{
				VkShaderModule module = info->pStages[j].module;
				unique_shader_modules.insert(module);
				unsigned index = replayer.module_to_index[module];
				auto *module_info = replayer.shader_module_infos[index];
				disassembled = disassemble_spirv(device, replayer.graphics_pipelines[i], method, info->pStages[j].stage,
				                                 module_info, info->pStages[j].pName);

				Hash module_hash = replayer.module_hashes[index];

				string path = output + "/" + uint64_string(module_hash) + "." +
				              info->pStages[j].pName + "." +
				              uint64_string(replayer.graphics_hashes[i]) +
				              "." + stage_to_string(info->pStages[j].stage);

				if (disasm_match.empty())
					LOGI("Dumping disassembly to: %s\n", path.c_str());
				else if (disassembled.find(disasm_match) != std::string::npos)
					LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

				if (!write_string_to_file(path.c_str(), disassembled.c_str()))
				{
					LOGE("Failed to write disassembly to file: %s\n", output.c_str());
					return EXIT_FAILURE;
				}
			}
		}

		size_t compute_pipeline_count = replayer.compute_infos.size();
		for (size_t i = 0; i < compute_pipeline_count; i++)
		{
			auto *info = replayer.compute_infos[i];
			VkShaderModule module = info->stage.module;
			unique_shader_modules.insert(module);

			unsigned index = replayer.module_to_index[module];
			auto *module_info = replayer.shader_module_infos[index];
			disassembled = disassemble_spirv(device, replayer.compute_pipelines[i], method, info->stage.stage,
			                                 module_info, info->stage.pName);

			Hash module_hash = replayer.module_hashes[index];

			string path = output + "/" + uint64_string(module_hash) + "." +
			              info->stage.pName + "." +
			              uint64_string(replayer.compute_hashes[i]) +
			              "." + stage_to_string(info->stage.stage);

			if (disasm_match.empty())
				LOGI("Dumping disassembly to: %s\n", path.c_str());
			else if (disassembled.find(disasm_match) != std::string::npos)
				LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

			if (!write_string_to_file(path.c_str(), disassembled.c_str()))
			{
				LOGE("Failed to write disassembly to file: %s\n", output.c_str());
				return EXIT_FAILURE;
			}
		}

		size_t raytracing_pipeline_count = replayer.raytracing_infos.size();
		for (size_t i = 0; i < raytracing_pipeline_count; i++)
		{
			auto *info = replayer.raytracing_infos[i];
			for (uint32_t j = 0; j < info->stageCount; j++)
			{
				VkShaderModule module = info->pStages[j].module;
				unique_shader_modules.insert(module);
				unsigned index = replayer.module_to_index[module];
				auto *module_info = replayer.shader_module_infos[index];
				disassembled = disassemble_spirv(device, replayer.raytracing_pipelines[i], method, info->pStages[j].stage,
												 module_info, info->pStages[j].pName);

				Hash module_hash = replayer.module_hashes[index];

				string path = output + "/" + uint64_string(module_hash) + "." +
						info->pStages[j].pName + "." +
						uint64_string(replayer.raytracing_hashes[i]) +
						"." + stage_to_string(info->pStages[j].stage);

				if (disasm_match.empty())
					LOGI("Dumping disassembly to: %s\n", path.c_str());
				else if (disassembled.find(disasm_match) != std::string::npos)
					LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

				if (!write_string_to_file(path.c_str(), disassembled.c_str()))
				{
					LOGE("Failed to write disassembly to file: %s\n", output.c_str());
					return EXIT_FAILURE;
				}
			}
		}

		LOGI("Shader modules used: %u, shader modules in database: %u\n",
		     unsigned(unique_shader_modules.size()), unsigned(replayer.shader_module_infos.size()));
	}
	return EXIT_SUCCESS;
}